

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceQuadTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner0,int inner1,int outer0,
          int outer1,int outer2,int outer3)

{
  uint inner1_00;
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Vector<float,_3> local_78;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  ulong local_48;
  int local_3c;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_38;
  
  local_48 = (ulong)(uint)inner1;
  local_68 = (void *)0x0;
  uStack_60 = 0;
  local_58 = (pointer)0x0;
  if (inner1 == 1 || inner0 == 1) {
    if ((((inner0 != 1) || (inner1 != 1)) || (outer0 != 1)) ||
       (((outer1 != 1 || (outer2 != 1)) || (outer3 != 1)))) {
      inner1_00 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
      if (inner0 < 2) {
        inner0 = inner1_00;
      }
      if (1 < inner1) {
        inner1_00 = inner1;
      }
      generateReferenceQuadTessCoords
                (__return_storage_ptr__,spacingMode,inner0,inner1_00,outer0,outer1,outer2,outer3);
      if (local_68 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_68,(long)local_58 - (long)local_68);
      return __return_storage_ptr__;
    }
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
  }
  else {
    local_6c = (float)outer1;
    local_38 = __return_storage_ptr__;
    if (0 < outer0) {
      iVar2 = 0;
      do {
        local_78.m_data[1] = (float)iVar2 / (float)outer0;
        local_78.m_data[0] = 0.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar2 = iVar2 + 1;
      } while (outer0 != iVar2);
    }
    fVar4 = local_6c;
    if (0 < (int)local_6c) {
      fVar3 = (float)(int)local_6c;
      iVar2 = 0;
      do {
        local_78.m_data[0] = 1.0 - (float)iVar2 / fVar3;
        local_78.m_data[1] = 0.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar2 = iVar2 + 1;
      } while (fVar4 != (float)iVar2);
    }
    if (0 < outer2) {
      iVar2 = 0;
      do {
        local_78.m_data[1] = 1.0 - (float)iVar2 / (float)outer2;
        local_78.m_data[0] = 1.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar2 = iVar2 + 1;
      } while (outer2 != iVar2);
    }
    if (0 < outer3) {
      iVar2 = 0;
      do {
        local_78.m_data[0] = (float)iVar2 / (float)outer3;
        local_78.m_data[1] = 1.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar2 = iVar2 + 1;
      } while (outer3 != iVar2);
    }
    local_3c = (int)local_48 + -1;
    if (0 < local_3c) {
      local_6c = (float)inner0;
      local_48 = CONCAT44(local_48._4_4_,(float)(int)local_48);
      iVar2 = 0;
      do {
        iVar2 = iVar2 + 1;
        if (0 < inner0 + -1) {
          fVar4 = (float)iVar2 / (float)local_48;
          iVar1 = 1;
          do {
            local_78.m_data[0] = (float)iVar1 / local_6c;
            local_78.m_data[2] = 0.0;
            local_78.m_data[1] = fVar4;
            std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
            emplace_back<tcu::Vector<float,3>>
                      ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                       &local_68,&local_78);
            iVar1 = iVar1 + 1;
          } while (inner0 != iVar1);
        }
      } while (iVar2 != local_3c);
    }
    __return_storage_ptr__ = local_38;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (undefined4)local_68;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start + 4) = local_68._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (undefined4)uStack_60;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_finish + 4) = uStack_60._4_4_;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_58;
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceQuadTessCoords (const SpacingMode	spacingMode,
														const int			inner0,
														const int			inner1,
														const int			outer0,
														const int			outer1,
														const int			outer2,
														const int			outer3)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner0 == 1 || inner1 == 1)
	{
		if (inner0 == 1 && inner1 == 1 && outer0 == 1 && outer1 == 1 && outer2 == 1 && outer3 == 1)
		{
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 1.0f, 0.0f));
			return tessCoords;
		}
		else
			return generateReferenceQuadTessCoords(spacingMode, inner0 > 1 ? inner0 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																inner1 > 1 ? inner1 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																outer0, outer1, outer2, outer3);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 0.0f)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f, 0.0f)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(    1.0f, 1.0f - v, 0.0f)); }
		for (int i = 0; i < outer3; i++) { const float v = (float)i / (float)outer3; tessCoords.push_back(tcu::Vec3(       v,     1.0f, 0.0f)); }

		for (int innerVtxY = 0; innerVtxY < inner1-1; innerVtxY++)
		for (int innerVtxX = 0; innerVtxX < inner0-1; innerVtxX++)
			tessCoords.push_back(tcu::Vec3((float)(innerVtxX + 1) / (float)inner0,
										   (float)(innerVtxY + 1) / (float)inner1,
										   0.0f));

		return tessCoords;
	}
}